

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

bool ImGui::IsMouseHoveringRect(ImVec2 *r_min,ImVec2 *r_max,bool clip)

{
  ImGuiWindow *pIVar1;
  ImGuiContext *g;
  undefined3 in_register_00000011;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  
  fVar8 = r_min->x;
  fVar3 = r_min->y;
  fVar5 = r_max->x;
  if (CONCAT31(in_register_00000011,clip) != 0) {
    pIVar1 = GImGui->CurrentWindow;
    fVar7 = (pIVar1->ClipRect).Min.x;
    fVar2 = (pIVar1->ClipRect).Min.y;
    if (fVar7 <= fVar8) {
      fVar7 = fVar8;
    }
    if (fVar2 <= fVar3) {
      fVar2 = fVar3;
    }
    fVar4 = (pIVar1->ClipRect).Max.x;
    if (fVar5 <= fVar4) {
      fVar4 = fVar5;
    }
    fVar6 = (pIVar1->ClipRect).Max.y;
    fVar3 = fVar2;
    fVar5 = fVar4;
    fVar8 = fVar7;
    if (fVar6 < r_max->y) goto LAB_0013041e;
  }
  fVar2 = fVar3;
  fVar4 = fVar5;
  fVar6 = r_max->y;
  fVar7 = fVar8;
LAB_0013041e:
  fVar8 = (GImGui->Style).TouchExtraPadding.x;
  fVar3 = (GImGui->IO).MousePos.x;
  if (fVar7 - fVar8 <= fVar3) {
    fVar5 = (GImGui->Style).TouchExtraPadding.y;
    fVar7 = (GImGui->IO).MousePos.y;
    return (bool)(fVar7 < fVar6 + fVar5 & -(fVar2 - fVar5 <= fVar7) & -(fVar3 < fVar4 + fVar8));
  }
  return false;
}

Assistant:

bool ImGui::IsMouseHoveringRect(const ImVec2& r_min, const ImVec2& r_max, bool clip)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = GetCurrentWindowRead();

    // Clip
    ImRect rect_clipped(r_min, r_max);
    if (clip)
        rect_clipped.Clip(window->ClipRect);

    // Expand for touch input
    const ImRect rect_for_touch(rect_clipped.Min - g.Style.TouchExtraPadding, rect_clipped.Max + g.Style.TouchExtraPadding);
    return rect_for_touch.Contains(g.IO.MousePos);
}